

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataStructures.pb.cc
# Opt level: O3

uint8_t * __thiscall
CoreML::Specification::DoubleVector::_InternalSerialize
          (DoubleVector *this,uint8_t *target,EpsCopyOutputStream *stream)

{
  void *pvVar1;
  bool bVar2;
  LogMessage *other;
  ulong uVar3;
  byte *pbVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  uint size;
  size_t sVar8;
  byte *ptr;
  LogFinisher local_61;
  LogMessage local_60;
  
  iVar7 = (this->vector_).current_size_;
  if (0 < iVar7) {
    pbVar4 = stream->end_;
    if (pbVar4 <= target) {
      target = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
      iVar7 = (this->vector_).current_size_;
      pbVar4 = stream->end_;
    }
    if (pbVar4 <= target) {
      google::protobuf::internal::LogMessage::LogMessage
                (&local_60,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/io/coded_stream.h"
                 ,0x36d);
      other = google::protobuf::internal::LogMessage::operator<<
                        (&local_60,"CHECK failed: ptr < end_: ");
      google::protobuf::internal::LogFinisher::operator=(&local_61,other);
      google::protobuf::internal::LogMessage::~LogMessage(&local_60);
    }
    size = iVar7 << 3;
    *target = 10;
    pbVar4 = target + 1;
    uVar6 = size;
    uVar5 = size;
    if (0x7f < size) {
      do {
        target = pbVar4;
        *target = (byte)uVar5 | 0x80;
        uVar6 = uVar5 >> 7;
        pbVar4 = target + 1;
        bVar2 = 0x3fff < uVar5;
        uVar5 = uVar6;
      } while (bVar2);
    }
    ptr = target + 2;
    *pbVar4 = (byte)uVar6;
    pvVar1 = (this->vector_).arena_or_elements_;
    sVar8 = (size_t)(int)size;
    if ((long)stream->end_ - (long)ptr < (long)sVar8) {
      target = google::protobuf::io::EpsCopyOutputStream::WriteRawFallback(stream,pvVar1,size,ptr);
    }
    else {
      memcpy(ptr,pvVar1,sVar8);
      target = ptr + sVar8;
    }
  }
  uVar3 = (this->super_MessageLite)._internal_metadata_.ptr_;
  if ((uVar3 & 1) != 0) {
    uVar3 = uVar3 & 0xfffffffffffffffc;
    pvVar1 = *(void **)(uVar3 + 8);
    iVar7 = (int)*(undefined8 *)(uVar3 + 0x10);
    sVar8 = (size_t)iVar7;
    if ((long)stream->end_ - (long)target < (long)sVar8) {
      target = google::protobuf::io::EpsCopyOutputStream::WriteRawFallback
                         (stream,pvVar1,iVar7,target);
    }
    else {
      memcpy(target,pvVar1,sVar8);
      target = target + sVar8;
    }
  }
  return target;
}

Assistant:

uint8_t* DoubleVector::_InternalSerialize(
    uint8_t* target, ::PROTOBUF_NAMESPACE_ID::io::EpsCopyOutputStream* stream) const {
  // @@protoc_insertion_point(serialize_to_array_start:CoreML.Specification.DoubleVector)
  uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  // repeated double vector = 1;
  if (this->_internal_vector_size() > 0) {
    target = stream->WriteFixedPacked(1, _internal_vector(), target);
  }

  if (PROTOBUF_PREDICT_FALSE(_internal_metadata_.have_unknown_fields())) {
    target = stream->WriteRaw(_internal_metadata_.unknown_fields<std::string>(::PROTOBUF_NAMESPACE_ID::internal::GetEmptyString).data(),
        static_cast<int>(_internal_metadata_.unknown_fields<std::string>(::PROTOBUF_NAMESPACE_ID::internal::GetEmptyString).size()), target);
  }
  // @@protoc_insertion_point(serialize_to_array_end:CoreML.Specification.DoubleVector)
  return target;
}